

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

void mon_create_mimicked_object(chunk *c,monster *mon,wchar_t index)

{
  loc_conflict grid;
  _Bool _Var1;
  uint8_t uVar2;
  uint32_t uVar3;
  _Bool local_3d;
  uint32_t local_3c;
  _Bool dummy;
  monster_mimic *pmStack_38;
  wchar_t i;
  monster_mimic *mimic_kind;
  object_kind *kind;
  object *obj;
  monster *pmStack_18;
  wchar_t index_local;
  monster *mon_local;
  chunk *c_local;
  
  mimic_kind = (monster_mimic *)mon->race->mimic_kinds->kind;
  local_3c = 1;
  local_3d = true;
  obj._4_4_ = index;
  pmStack_18 = mon;
  mon_local = (monster *)c;
  for (pmStack_38 = mon->race->mimic_kinds; pmStack_38 != (monster_mimic *)0x0;
      pmStack_38 = pmStack_38->next) {
    uVar3 = Rand_div(local_3c);
    if (uVar3 == 0) {
      mimic_kind = (monster_mimic *)pmStack_38->kind;
    }
    local_3c = local_3c + 1;
  }
  _Var1 = tval_is_money_k((object_kind *)mimic_kind);
  if (_Var1) {
    kind = (object_kind *)
           make_gold(*(wchar_t *)((long)&mon_local->original_race + 4),(char *)mimic_kind->next);
  }
  else {
    kind = (object_kind *)object_new();
    object_prep((object *)kind,(object_kind *)mimic_kind,pmStack_18->race->level,RANDOMISE);
    apply_magic((object *)kind,pmStack_18->race->level,true,false,false,false);
    *(undefined1 *)((long)&kind->modifiers[9].m_bonus + 2) = 1;
    *(undefined1 *)&kind->modifiers[10].dice = 0x18;
    uVar2 = convert_depth_to_origin(*(wchar_t *)((long)&mon_local->original_race + 4));
    *(uint8_t *)((long)&kind->modifiers[10].dice + 1) = uVar2;
    *(short *)((long)&kind->modifiers[10].dice + 2) = (short)*(undefined4 *)&mon_local->player_race;
  }
  *(short *)((long)&kind->modifiers[10].base + 2) = (short)obj._4_4_;
  pmStack_18->mimicked_obj = (object *)kind;
  grid.x = (pmStack_18->grid).x;
  grid.y = (pmStack_18->grid).y;
  _Var1 = floor_carry((chunk *)mon_local,grid,(object *)kind,&local_3d);
  if (_Var1) {
    list_object((chunk_conflict *)mon_local,(object *)kind);
  }
  else {
    *(undefined2 *)((long)&kind->modifiers[10].base + 2) = 0;
    pmStack_18->mimicked_obj = (object *)0x0;
    _Var1 = flag_has_dbg(pmStack_18->race->flags,0xc,0x1e,"mon->race->flags","RF_MIMIC_INV");
    if (_Var1) {
      monster_carry((chunk *)mon_local,pmStack_18,(object *)kind);
    }
    else {
      object_delete((chunk *)mon_local,(chunk *)0x0,(object **)&kind);
    }
  }
  return;
}

Assistant:

void mon_create_mimicked_object(struct chunk *c, struct monster *mon, int index)
{
	struct object *obj;
	struct object_kind *kind = mon->race->mimic_kinds->kind;
	struct monster_mimic *mimic_kind;
	int i = 1;
	bool dummy = true;

	/* Pick a random object kind to mimic */
	for (mimic_kind = mon->race->mimic_kinds;
		 mimic_kind;
		 mimic_kind = mimic_kind->next, i++) {
		if (one_in_(i)) {
			kind = mimic_kind->kind;
		}
	}

	if (tval_is_money_k(kind)) {
		obj = make_gold(c->depth, kind->name);
	} else {
		obj = object_new();
		object_prep(obj, kind, mon->race->level, RANDOMISE);
		apply_magic(obj, mon->race->level, true, false, false, false);
		obj->number = 1;
		obj->origin = ORIGIN_DROP_MIMIC;
		obj->origin_depth = convert_depth_to_origin(c->depth);
		obj->origin_place = c->place;
	}

	obj->mimicking_m_idx = index;
	mon->mimicked_obj = obj;

	/* Put the object on the floor if it goes, otherwise no mimicry */
	if (floor_carry(c, mon->grid, obj, &dummy)) {
		list_object(c, obj);
	} else {
		/* Clear the mimicry */
		obj->mimicking_m_idx = 0;
		mon->mimicked_obj = NULL;

		/* Give the object to the monster if appropriate */
		if (rf_has(mon->race->flags, RF_MIMIC_INV)) {
			monster_carry(c, mon, obj);
		} else {
			/* Otherwise delete the mimicked object */
			object_delete(c, NULL, &obj);
		}
	}
}